

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,uint c)

{
  unsigned_short local_2c;
  unsigned_short local_16;
  uint local_14;
  ImGuiIO *pIStack_10;
  uint c_local;
  ImGuiIO *this_local;
  
  if (c != 0) {
    if (c < 0x10000) {
      local_2c = (unsigned_short)c;
    }
    else {
      local_2c = 0xfffd;
    }
    local_16 = local_2c;
    local_14 = c;
    pIStack_10 = this;
    ImVector<unsigned_short>::push_back(&this->InputQueueCharacters,&local_16);
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(unsigned int c)
{
    if (c != 0)
        InputQueueCharacters.push_back(c <= IM_UNICODE_CODEPOINT_MAX ? (ImWchar)c : IM_UNICODE_CODEPOINT_INVALID);
}